

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lnsrchmp.c
# Opt level: O0

int stopcheck3_mt(double *xi,double *xf,double fx,int N,double fo,double *jac,double *dx,double eps,
                 double stoptol,double functol,int retval)

{
  double *array;
  double dVar1;
  double dVar2;
  double *scheck;
  double stop0;
  double den;
  double num;
  double relfit;
  double nrmnx;
  double nrm;
  int local_68;
  int i;
  int rcode;
  int retval_local;
  double functol_local;
  double stoptol_local;
  double eps_local;
  double *dx_local;
  double *jac_local;
  double fo_local;
  int N_local;
  double fx_local;
  double *xf_local;
  double *xi_local;
  
  local_68 = 0;
  array = (double *)malloc((long)N << 3);
  if (retval == 3) {
    xi_local._4_4_ = 4;
  }
  else if (retval == 0xf) {
    xi_local._4_4_ = 0xf;
  }
  else {
    dVar1 = l2norm(jac,N);
    if (eps <= ABS(fo)) {
      dVar2 = (fx - fo) / fo;
    }
    else {
      dVar2 = fx - fo;
    }
    num = ABS(dVar2);
    if (stoptol <= dVar1 / (double)N) {
      if (functol <= num) {
        for (nrm._4_4_ = 0; nrm._4_4_ < N; nrm._4_4_ = nrm._4_4_ + 1) {
          array[nrm._4_4_] = ABS(xf[nrm._4_4_] - xi[nrm._4_4_]) / (ABS(xf[nrm._4_4_]) + 1.0);
        }
        dVar1 = array_max_abs(array,N);
        if (dVar1 <= stoptol) {
          local_68 = 2;
        }
      }
      else {
        local_68 = 6;
      }
    }
    else {
      local_68 = 1;
    }
    free(array);
    xi_local._4_4_ = local_68;
  }
  return xi_local._4_4_;
}

Assistant:

int stopcheck3_mt(double *xi,double *xf,double fx, int N, double fo, double *jac, double *dx, double eps,
		double stoptol, double functol, int retval) {
	int rcode,i;
	double nrm,nrmnx,relfit,num,den,stop0;
	double *scheck;
	rcode = 0;

	scheck = (double*)malloc(sizeof(double)*N);

	if (retval == 3) {
		rcode = 4;
		return rcode;
	}
	if (retval == 15) {
		rcode = 15;
		return rcode;
	}

	nrm = l2norm(jac, N);
	nrmnx = nrm / (double) N;

	if (fabs(fo) < eps) {
		relfit = fabs(fx - fo);
	}
	else {
		relfit = fabs((fx - fo)/fo);
	}

	if (nrmnx < stoptol) {
		rcode = 1; // Successful Convergence
	} else if (relfit < functol) {
		rcode = 6; // Relative fit less than function tolerance
	} else {
		for (i = 0; i < N; ++i) {
			den = 1.0+fabs(xf[i]);
			num = fabs(xf[i] - xi[i]);
			scheck[i] = num / den;
		}
		stop0 = array_max_abs(scheck, N);
		if (stop0 <= stoptol) {
			rcode = 2;
		}
	}

	free(scheck);
	return rcode;
}